

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::concat<kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,FixedArray<char,_1UL> *params,
          FixedArray<char,_1UL> *params_1,FixedArray<char,_1UL> *params_2)

{
  size_t size;
  _ *p_Var1;
  initializer_list<unsigned_long> nums;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_38 = 1;
  local_30 = 1;
  local_28 = 1;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x3;
  size = sum((_ *)&local_38,nums);
  heapString(__return_storage_ptr__,size);
  p_Var1 = (_ *)(__return_storage_ptr__->content).size_;
  if (p_Var1 != (_ *)0x0) {
    p_Var1 = (_ *)(__return_storage_ptr__->content).ptr;
  }
  *p_Var1 = *this;
  p_Var1[1] = (_)params->content[0];
  p_Var1[2] = (_)params_1->content[0];
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}